

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O2

void nary_starvation(size_t W)

{
  FlowBuilder FVar1;
  int iVar2;
  pointer pcVar3;
  long *plVar4;
  ulong *puVar5;
  Node *pNVar6;
  ulong uVar7;
  Executor *this;
  ulong __val;
  Node *pNVar8;
  allocator<char> local_2f9;
  string local_2f8;
  size_t N;
  Node *local_2d0;
  ulong local_2c8;
  atomic<unsigned_long> count;
  atomic<unsigned_long> stop;
  size_t W_local;
  shared_ptr<tf::WorkerInterface> local_2a8;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> set;
  mutex mutex;
  Taskflow taskflow;
  Executor executor;
  
  N = 0x400;
  W_local = W;
  tf::Taskflow::Taskflow(&taskflow);
  local_2a8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_2a8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,W,&local_2a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2a8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  FVar1 = taskflow.super_FlowBuilder;
  mutex.super___mutex_base._M_mutex._16_8_ = 0;
  mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  mutex.super___mutex_base._M_mutex.__align = 0;
  mutex.super___mutex_base._M_mutex._8_8_ = 0;
  set._M_h._M_buckets = &set._M_h._M_single_bucket;
  set._M_h._M_bucket_count = 1;
  set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set._M_h._M_element_count = 0;
  set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set._M_h._M_rehash_policy._M_next_resize = 0;
  set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pcVar3 = (pointer)operator_new(0xd8);
  pcVar3[0] = '\0';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  *(pointer *)(pcVar3 + 8) = pcVar3 + 0x18;
  pcVar3[0x10] = '\0';
  pcVar3[0x11] = '\0';
  pcVar3[0x12] = '\0';
  pcVar3[0x13] = '\0';
  pcVar3[0x14] = '\0';
  pcVar3[0x15] = '\0';
  pcVar3[0x16] = '\0';
  pcVar3[0x17] = '\0';
  pcVar3[0x18] = '\0';
  pcVar3[0x28] = '\0';
  pcVar3[0x29] = '\0';
  pcVar3[0x2a] = '\0';
  pcVar3[0x2b] = '\0';
  pcVar3[0x2c] = '\0';
  pcVar3[0x2d] = '\0';
  pcVar3[0x2e] = '\0';
  pcVar3[0x2f] = '\0';
  pcVar3[0x30] = '\0';
  pcVar3[0x31] = '\0';
  pcVar3[0x32] = '\0';
  pcVar3[0x33] = '\0';
  pcVar3[0x34] = '\0';
  pcVar3[0x35] = '\0';
  pcVar3[0x36] = '\0';
  pcVar3[0x37] = '\0';
  pcVar3[0x38] = '\0';
  pcVar3[0x39] = '\0';
  pcVar3[0x3a] = '\0';
  pcVar3[0x3b] = '\0';
  pcVar3[0x3c] = '\0';
  pcVar3[0x3d] = '\0';
  pcVar3[0x3e] = '\0';
  pcVar3[0x3f] = '\0';
  pcVar3[0x40] = '\0';
  pcVar3[0x41] = '\0';
  pcVar3[0x42] = '\0';
  pcVar3[0x43] = '\0';
  pcVar3[0x44] = '\0';
  pcVar3[0x45] = '\0';
  pcVar3[0x46] = '\0';
  pcVar3[0x47] = '\0';
  *(pointer *)(pcVar3 + 0x48) = pcVar3 + 0x60;
  *(pointer *)(pcVar3 + 0x50) = pcVar3 + 0x60;
  *(pointer *)(pcVar3 + 0x58) = pcVar3 + 0x80;
  pcVar3[0x80] = '\0';
  pcVar3[0x81] = '\0';
  pcVar3[0x82] = '\0';
  pcVar3[0x83] = '\0';
  pcVar3[0x84] = '\0';
  pcVar3[0x85] = '\0';
  pcVar3[0x86] = '\0';
  pcVar3[0x87] = '\0';
  pcVar3[0x88] = '\0';
  pcVar3[0x89] = '\0';
  pcVar3[0x8a] = '\0';
  pcVar3[0x8b] = '\0';
  pcVar3[0x8c] = '\0';
  pcVar3[0x8d] = '\0';
  pcVar3[0x8e] = '\0';
  pcVar3[0x8f] = '\0';
  pcVar3[0x90] = '\0';
  pcVar3[0x91] = '\0';
  pcVar3[0x92] = '\0';
  pcVar3[0x93] = '\0';
  pcVar3[0x94] = '\0';
  pcVar3[0x95] = '\0';
  pcVar3[0x96] = '\0';
  pcVar3[0x97] = '\0';
  pcVar3[0x98] = '\0';
  pcVar3[0x99] = '\0';
  pcVar3[0x9a] = '\0';
  pcVar3[0x9b] = '\0';
  pcVar3[0x9c] = '\0';
  pcVar3[0x9d] = '\0';
  pcVar3[0x9e] = '\0';
  pcVar3[0x9f] = '\0';
  pcVar3[0xa0] = '\0';
  pcVar3[0xa1] = '\0';
  pcVar3[0xa2] = '\0';
  pcVar3[0xa3] = '\0';
  pcVar3[0xa4] = '\0';
  pcVar3[0xa5] = '\0';
  pcVar3[0xa6] = '\0';
  pcVar3[0xa7] = '\0';
  plVar4 = (long *)operator_new(0x18);
  *plVar4 = (long)&set;
  plVar4[1] = (long)&count;
  plVar4[2] = (long)&stop;
  *(long **)(pcVar3 + 0x88) = plVar4;
  *(code **)(pcVar3 + 0xa0) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:620:38)>
       ::_M_invoke;
  *(code **)(pcVar3 + 0x98) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:620:38)>
       ::_M_manager;
  pcVar3[0xc0] = '\x01';
  pcVar3[200] = '\0';
  pcVar3[0xc9] = '\0';
  pcVar3[0xca] = '\0';
  pcVar3[0xcb] = '\0';
  pcVar3[0xcc] = '\0';
  pcVar3[0xcd] = '\0';
  pcVar3[0xce] = '\0';
  pcVar3[0xcf] = '\0';
  pcVar3[0xd0] = '\0';
  pcVar3[0xd1] = '\0';
  pcVar3[0xd2] = '\0';
  pcVar3[0xd3] = '\0';
  pcVar3[0xd4] = '\0';
  pcVar3[0xd5] = '\0';
  pcVar3[0xd6] = '\0';
  pcVar3[0xd7] = '\0';
  local_2f8._M_dataplus._M_p = pcVar3;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar1._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_2f8);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_2f8);
  pNVar6 = ((FVar1._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"root",&local_2f9);
  std::__cxx11::string::_M_assign((string *)&pNVar6->_name);
  std::__cxx11::string::~string((string *)&local_2f8);
  pNVar8 = (Node *)0x0;
  for (__val = 0; local_2d0 = pNVar6, __val < W; __val = __val + 1) {
    iVar2 = rand();
    local_2c8 = (ulong)(long)iVar2 % N;
    pNVar6 = pNVar8;
    for (uVar7 = 0; FVar1._graph = taskflow.super_FlowBuilder._graph, uVar7 < N; uVar7 = uVar7 + 1)
    {
      pcVar3 = (pointer)operator_new(0xd8);
      pcVar3[0] = '\0';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
      *(pointer *)(pcVar3 + 8) = pcVar3 + 0x18;
      pcVar3[0x10] = '\0';
      pcVar3[0x11] = '\0';
      pcVar3[0x12] = '\0';
      pcVar3[0x13] = '\0';
      pcVar3[0x14] = '\0';
      pcVar3[0x15] = '\0';
      pcVar3[0x16] = '\0';
      pcVar3[0x17] = '\0';
      pcVar3[0x18] = '\0';
      pcVar3[0x28] = '\0';
      pcVar3[0x29] = '\0';
      pcVar3[0x2a] = '\0';
      pcVar3[0x2b] = '\0';
      pcVar3[0x2c] = '\0';
      pcVar3[0x2d] = '\0';
      pcVar3[0x2e] = '\0';
      pcVar3[0x2f] = '\0';
      pcVar3[0x30] = '\0';
      pcVar3[0x31] = '\0';
      pcVar3[0x32] = '\0';
      pcVar3[0x33] = '\0';
      pcVar3[0x34] = '\0';
      pcVar3[0x35] = '\0';
      pcVar3[0x36] = '\0';
      pcVar3[0x37] = '\0';
      pcVar3[0x38] = '\0';
      pcVar3[0x39] = '\0';
      pcVar3[0x3a] = '\0';
      pcVar3[0x3b] = '\0';
      pcVar3[0x3c] = '\0';
      pcVar3[0x3d] = '\0';
      pcVar3[0x3e] = '\0';
      pcVar3[0x3f] = '\0';
      pcVar3[0x40] = '\0';
      pcVar3[0x41] = '\0';
      pcVar3[0x42] = '\0';
      pcVar3[0x43] = '\0';
      pcVar3[0x44] = '\0';
      pcVar3[0x45] = '\0';
      pcVar3[0x46] = '\0';
      pcVar3[0x47] = '\0';
      *(pointer *)(pcVar3 + 0x48) = pcVar3 + 0x60;
      *(pointer *)(pcVar3 + 0x50) = pcVar3 + 0x60;
      *(pointer *)(pcVar3 + 0x58) = pcVar3 + 0x80;
      pcVar3[0x80] = '\0';
      pcVar3[0x81] = '\0';
      pcVar3[0x82] = '\0';
      pcVar3[0x83] = '\0';
      pcVar3[0x84] = '\0';
      pcVar3[0x85] = '\0';
      pcVar3[0x86] = '\0';
      pcVar3[0x87] = '\0';
      pcVar3[0x88] = '\0';
      pcVar3[0x89] = '\0';
      pcVar3[0x8a] = '\0';
      pcVar3[0x8b] = '\0';
      pcVar3[0x8c] = '\0';
      pcVar3[0x8d] = '\0';
      pcVar3[0x8e] = '\0';
      pcVar3[0x8f] = '\0';
      pcVar3[0x90] = '\0';
      pcVar3[0x91] = '\0';
      pcVar3[0x92] = '\0';
      pcVar3[0x93] = '\0';
      pcVar3[0x94] = '\0';
      pcVar3[0x95] = '\0';
      pcVar3[0x96] = '\0';
      pcVar3[0x97] = '\0';
      pcVar3[0x98] = '\0';
      pcVar3[0x99] = '\0';
      pcVar3[0x9a] = '\0';
      pcVar3[0x9b] = '\0';
      pcVar3[0x9c] = '\0';
      pcVar3[0x9d] = '\0';
      pcVar3[0x9e] = '\0';
      pcVar3[0x9f] = '\0';
      pcVar3[0xa0] = '\0';
      pcVar3[0xa1] = '\0';
      pcVar3[0xa2] = '\0';
      pcVar3[0xa3] = '\0';
      pcVar3[0xa4] = '\0';
      pcVar3[0xa5] = '\0';
      pcVar3[0xa6] = '\0';
      pcVar3[0xa7] = '\0';
      puVar5 = (ulong *)operator_new(0x48);
      *puVar5 = __val;
      puVar5[1] = local_2c8;
      puVar5[2] = uVar7;
      puVar5[3] = (ulong)&N;
      puVar5[4] = (ulong)&mutex;
      puVar5[5] = (ulong)&set;
      puVar5[6] = (ulong)&executor;
      puVar5[7] = (ulong)&count;
      puVar5[8] = (ulong)&stop;
      *(ulong **)(pcVar3 + 0x88) = puVar5;
      *(code **)(pcVar3 + 0xa0) =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:634:40)>
           ::_M_invoke;
      *(code **)(pcVar3 + 0x98) =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:634:40)>
           ::_M_manager;
      pcVar3[0xc0] = '\x01';
      pcVar3[200] = '\0';
      pcVar3[0xc9] = '\0';
      pcVar3[0xca] = '\0';
      pcVar3[0xcb] = '\0';
      pcVar3[0xcc] = '\0';
      pcVar3[0xcd] = '\0';
      pcVar3[0xce] = '\0';
      pcVar3[0xcf] = '\0';
      pcVar3[0xd0] = '\0';
      pcVar3[0xd1] = '\0';
      pcVar3[0xd2] = '\0';
      pcVar3[0xd3] = '\0';
      pcVar3[0xd4] = '\0';
      pcVar3[0xd5] = '\0';
      pcVar3[0xd6] = '\0';
      pcVar3[0xd7] = '\0';
      local_2f8._M_dataplus._M_p = pcVar3;
      std::
      vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                  *)FVar1._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_2f8)
      ;
      std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
                ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_2f8);
      pNVar8 = ((FVar1._graph)->
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               ).
               super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
               super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
               super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
      std::__cxx11::to_string(&local_2f8,__val);
      std::__cxx11::string::_M_assign((string *)&pNVar8->_name);
      std::__cxx11::string::~string((string *)&local_2f8);
      tf::Node::_precede(local_2d0,pNVar8);
      if (local_2c8 == uVar7) {
        pNVar6 = pNVar8;
      }
    }
    W = W_local;
    pNVar8 = pNVar6;
  }
  pcVar3 = (pointer)operator_new(0xd8);
  pcVar3[0] = '\0';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  *(pointer *)(pcVar3 + 8) = pcVar3 + 0x18;
  pcVar3[0x10] = '\0';
  pcVar3[0x11] = '\0';
  pcVar3[0x12] = '\0';
  pcVar3[0x13] = '\0';
  pcVar3[0x14] = '\0';
  pcVar3[0x15] = '\0';
  pcVar3[0x16] = '\0';
  pcVar3[0x17] = '\0';
  pcVar3[0x18] = '\0';
  pcVar3[0x28] = '\0';
  pcVar3[0x29] = '\0';
  pcVar3[0x2a] = '\0';
  pcVar3[0x2b] = '\0';
  pcVar3[0x2c] = '\0';
  pcVar3[0x2d] = '\0';
  pcVar3[0x2e] = '\0';
  pcVar3[0x2f] = '\0';
  pcVar3[0x30] = '\0';
  pcVar3[0x31] = '\0';
  pcVar3[0x32] = '\0';
  pcVar3[0x33] = '\0';
  pcVar3[0x34] = '\0';
  pcVar3[0x35] = '\0';
  pcVar3[0x36] = '\0';
  pcVar3[0x37] = '\0';
  pcVar3[0x38] = '\0';
  pcVar3[0x39] = '\0';
  pcVar3[0x3a] = '\0';
  pcVar3[0x3b] = '\0';
  pcVar3[0x3c] = '\0';
  pcVar3[0x3d] = '\0';
  pcVar3[0x3e] = '\0';
  pcVar3[0x3f] = '\0';
  pcVar3[0x40] = '\0';
  pcVar3[0x41] = '\0';
  pcVar3[0x42] = '\0';
  pcVar3[0x43] = '\0';
  pcVar3[0x44] = '\0';
  pcVar3[0x45] = '\0';
  pcVar3[0x46] = '\0';
  pcVar3[0x47] = '\0';
  *(pointer *)(pcVar3 + 0x48) = pcVar3 + 0x60;
  *(pointer *)(pcVar3 + 0x50) = pcVar3 + 0x60;
  *(pointer *)(pcVar3 + 0x58) = pcVar3 + 0x80;
  pcVar3[0x80] = '\0';
  pcVar3[0x81] = '\0';
  pcVar3[0x82] = '\0';
  pcVar3[0x83] = '\0';
  pcVar3[0x84] = '\0';
  pcVar3[0x85] = '\0';
  pcVar3[0x86] = '\0';
  pcVar3[0x87] = '\0';
  pcVar3[0x88] = '\0';
  pcVar3[0x89] = '\0';
  pcVar3[0x8a] = '\0';
  pcVar3[0x8b] = '\0';
  pcVar3[0x8c] = '\0';
  pcVar3[0x8d] = '\0';
  pcVar3[0x8e] = '\0';
  pcVar3[0x8f] = '\0';
  pcVar3[0x90] = '\0';
  pcVar3[0x91] = '\0';
  pcVar3[0x92] = '\0';
  pcVar3[0x93] = '\0';
  pcVar3[0x94] = '\0';
  pcVar3[0x95] = '\0';
  pcVar3[0x96] = '\0';
  pcVar3[0x97] = '\0';
  pcVar3[0x98] = '\0';
  pcVar3[0x99] = '\0';
  pcVar3[0x9a] = '\0';
  pcVar3[0x9b] = '\0';
  pcVar3[0x9c] = '\0';
  pcVar3[0x9d] = '\0';
  pcVar3[0x9e] = '\0';
  pcVar3[0x9f] = '\0';
  pcVar3[0xa0] = '\0';
  pcVar3[0xa1] = '\0';
  pcVar3[0xa2] = '\0';
  pcVar3[0xa3] = '\0';
  pcVar3[0xa4] = '\0';
  pcVar3[0xa5] = '\0';
  pcVar3[0xa6] = '\0';
  pcVar3[0xa7] = '\0';
  plVar4 = (long *)operator_new(0x20);
  *plVar4 = (long)&count;
  plVar4[1] = (long)&W_local;
  plVar4[2] = (long)&stop;
  plVar4[3] = (long)&set;
  *(long **)(pcVar3 + 0x88) = plVar4;
  *(code **)(pcVar3 + 0xa0) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:668:28)>
       ::_M_invoke;
  *(code **)(pcVar3 + 0x98) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:668:28)>
       ::_M_manager;
  pcVar3[0xc0] = '\x01';
  pcVar3[200] = '\0';
  pcVar3[0xc9] = '\0';
  pcVar3[0xca] = '\0';
  pcVar3[0xcb] = '\0';
  pcVar3[0xcc] = '\0';
  pcVar3[0xcd] = '\0';
  pcVar3[0xce] = '\0';
  pcVar3[0xcf] = '\0';
  pcVar3[0xd0] = '\0';
  pcVar3[0xd1] = '\0';
  pcVar3[0xd2] = '\0';
  pcVar3[0xd3] = '\0';
  pcVar3[0xd4] = '\0';
  pcVar3[0xd5] = '\0';
  pcVar3[0xd6] = '\0';
  pcVar3[0xd7] = '\0';
  local_2f8._M_dataplus._M_p = pcVar3;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)taskflow.super_FlowBuilder._graph,
             (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_2f8);
  pNVar8 = local_2d0;
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_2f8);
  pNVar6 = ((taskflow.super_FlowBuilder._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"stop",&local_2f9);
  std::__cxx11::string::_M_assign((string *)&pNVar6->_name);
  std::__cxx11::string::~string((string *)&local_2f8);
  tf::Node::_precede(pNVar8,pNVar6);
  this = &executor;
  tf::Executor::run_n((Future<void> *)&local_2f8,this,&taskflow,5);
  std::__basic_future<void>::wait((__basic_future<void> *)&local_2f8,this);
  tf::Future<void>::~Future((Future<void> *)&local_2f8);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&set._M_h);
  tf::Executor::~Executor(&executor);
  tf::Taskflow::~Taskflow(&taskflow);
  return;
}

Assistant:

void nary_starvation(size_t W) {
  
  size_t N = 1024;

  tf::Taskflow taskflow;
  tf::Executor executor(W);

  std::atomic<size_t> stop, count;
  
  // all worker must be involved
  std::mutex mutex;
  std::unordered_set<int> set;

  tf::Task parent = taskflow.emplace([&](){ 
    set.clear();
    count.store(0, std::memory_order_relaxed);
    stop.store(false, std::memory_order_relaxed);
  }).name("root");

  tf::Task pivot;

  for(size_t w=0; w<W; w++) {
    
    // randomly choose a pivot to be the parent for the next level
    size_t p = rand()%N;

    for(size_t i=0; i<N; i++) {
      tf::Task task = taskflow.emplace([&, w, p, i](){
        
        // the blocker cannot be the pivot - others simply return
        if(i != (p+1)%N) {
          std::this_thread::yield();
          return;
        }
        
        // now I need to block
        if(w) {
          // record the worker
          {
            std::scoped_lock lock(mutex);
            set.insert(executor.this_worker_id());
          }

          count.fetch_add(1, std::memory_order_release);

          // block the worker
          while(stop.load(std::memory_order_relaxed) == false) {
            std::this_thread::yield();
          }
        }
      }).name(std::to_string(w));

      parent.precede(task);

      if(p == i) {
        pivot = task;
      }
    }
    parent = pivot;
  }

  pivot = taskflow.emplace([&](){
    // wait for the other W-1 workers to block
    while(count.load(std::memory_order_acquire) + 1 != W) {
      std::this_thread::yield();
    }
    stop.store(true, std::memory_order_relaxed);
    REQUIRE(set.size() + 1 == W);
  }).name("stop");

  parent.precede(pivot);

  //taskflow.dump(std::cout);

  executor.run_n(taskflow, 5).wait();
}